

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void fs_add_serializer_metainfo_f(void *serializer,char *name,int name_length,float value)

{
  allocator local_41;
  string local_40;
  float local_20;
  int local_1c;
  float value_local;
  int name_length_local;
  char *name_local;
  void *serializer_local;
  
  local_20 = value;
  local_1c = name_length;
  _value_local = name;
  name_local = (char *)serializer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,name,(long)name_length,&local_41);
  ser::Serializer::AddMetainfo<float>((Serializer *)serializer,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void fs_add_serializer_metainfo_f(void* serializer, const char* name, int name_length,  float value)
{
    reinterpret_cast<Serializer*>(serializer)->AddMetainfo(std::string(name, name_length), value);
}